

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::printEssentialMatrix(translation_t *position,rotation_t *rotation)

{
  undefined8 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  long lVar4;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pDVar5;
  ostream *poVar6;
  size_t r;
  long lVar7;
  undefined8 *extraout_RDX;
  undefined8 *puVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  essential_t E;
  undefined8 auStack_60 [2];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_50 [72];
  
  dVar14 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[2];
  auVar19._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = 0x8000000000000000;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar14;
  auVar15._0_8_ = -dVar14;
  auVar16 = vpunpcklqdq_avx((undefined1  [16])0x0,auVar18);
  auVar18 = *(undefined1 (*) [16])
             (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array;
  dVar14 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[1];
  auVar20._8_8_ = dVar14;
  auVar20._0_8_ = dVar14;
  auVar19 = vpunpcklqdq_avx(auVar20,auVar18 ^ auVar19);
  lVar4 = 0x10;
  do {
    dVar14 = *(double *)
              ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array + lVar4);
    auVar21._8_8_ = dVar14;
    auVar21._0_8_ = dVar14;
    auVar20 = vpermilpd_avx(*(undefined1 (*) [16])
                             ((long)(rotation->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array + lVar4 + -0x10),1);
    uVar1 = *(undefined8 *)
             ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array + lVar4 + -0x10);
    auVar10._8_8_ = uVar1;
    auVar10._0_8_ = uVar1;
    auVar10 = vmulpd_avx512vl(auVar16,auVar10);
    uVar1 = *(undefined8 *)
             ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array + lVar4 + -8);
    auVar3._8_8_ = uVar1;
    auVar3._0_8_ = uVar1;
    auVar15._8_8_ = 0;
    auVar10 = vfmadd231pd_avx512vl(auVar10,auVar15,auVar3);
    auVar10 = vfmadd231pd_fma(auVar10,auVar19,auVar21);
    *(undefined1 (*) [16])((long)auStack_60 + lVar4) = auVar10;
    auVar22._0_8_ = auVar18._0_8_ * auVar20._0_8_;
    auVar22._8_8_ = auVar18._8_8_ * auVar20._8_8_;
    auVar20 = vshufpd_avx(auVar22,auVar22,1);
    *(double *)(local_50 + lVar4) = (auVar22._0_8_ + dVar14 * 0.0) - auVar20._0_8_;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x58);
  dVar14 = 0.0;
  pDVar5 = local_50;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      dVar14 = dVar14 + *(double *)(pDVar5 + lVar7) * *(double *)(pDVar5 + lVar7);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    lVar4 = lVar4 + 1;
    pDVar5 = pDVar5 + 8;
  } while (lVar4 != 3);
  if (dVar14 < 0.0) {
    auStack_60[0] = 0x25d363;
    dVar14 = sqrt(dVar14);
    puVar8 = extraout_RDX;
  }
  else {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar14;
    auVar18 = vsqrtsd_avx(auVar16,auVar16);
    dVar14 = auVar18._0_8_;
    puVar8 = (undefined8 *)0x48;
  }
  auVar17._8_8_ = dVar14;
  auVar17._0_8_ = dVar14;
  auVar17._16_8_ = dVar14;
  auVar17._24_8_ = dVar14;
  auVar11 = vpbroadcastq_avx512vl();
  auVar11 = vpaddq_avx2(auVar11,_DAT_002657a0);
  lVar7 = 0;
  uVar9 = CONCAT71((int7)((ulong)lVar4 >> 8),7) & 0xffffffff;
  do {
    auVar12 = vpbroadcastq_avx512vl();
    auVar12 = vpsllq_avx2(auVar12,3);
    auVar2 = vpaddq_avx2(auVar11,auVar12);
    auVar12 = vgatherqpd_avx512vl(*puVar8);
    auVar13._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar12._8_8_;
    auVar13._0_8_ = (ulong)((byte)uVar9 & 1) * auVar12._0_8_;
    auVar13._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar12._16_8_;
    auVar13._24_8_ = 0;
    auVar12 = vdivpd_avx(auVar13,auVar17);
    vscatterqpd_avx512vl(ZEXT832(0) + auVar2,uVar9,auVar12);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auStack_60[0] = 0x25d3e1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the random essential matrix is:",0x1f);
  auStack_60[0] = 0x25d3f5;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  auStack_60[0] = 0x25d400;
  std::ostream::put('X');
  auStack_60[0] = 0x25d408;
  std::ostream::flush();
  auStack_60[0] = 0x25d415;
  poVar6 = Eigen::operator<<((ostream *)&std::cout,local_50);
  auStack_60[0] = 0x25d42c;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  auStack_60[0] = 0x25d437;
  std::ostream::put((char)poVar6);
  auStack_60[0] = 0x25d43f;
  std::ostream::flush();
  return;
}

Assistant:

void
opengv::printEssentialMatrix(
    const translation_t & position,
    const rotation_t & rotation)
{
  //E transforms vectors from vp 2 to 1: x_1^T * E * x_2 = 0
  //and E = (t)_skew*R
  Eigen::Matrix3d t_skew = Eigen::Matrix3d::Zero();
  t_skew(0,1) = -position[2];
  t_skew(0,2) = position[1];
  t_skew(1,0) = position[2];
  t_skew(1,2) = -position[0];
  t_skew(2,0) = -position[1];
  t_skew(2,1) = position[0];

  essential_t E = t_skew * rotation;
  double matrixNorm = 0.0;
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      matrixNorm += pow(E(r,c),2);
  }
  matrixNorm = sqrt(matrixNorm);
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      E(r,c) = E(r,c) / matrixNorm;
  }

  std::cout << "the random essential matrix is:" << std::endl;
  std::cout << E << std::endl;
}